

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

ssize_t read_abi_cxx11_(int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  size_t in_RCX;
  undefined4 in_register_0000003c;
  long *plVar2;
  ulong uVar3;
  
  plVar2 = (long *)CONCAT44(in_register_0000003c,__fd);
  *plVar2 = (long)(plVar2 + 2);
  uVar3 = 0;
  std::__cxx11::string::_M_construct((ulong)plVar2,(char)__nbytes);
  do {
    sVar1 = fmt::v5::file::read((file *)__buf,(int)*plVar2 + (int)uVar3,(void *)(__nbytes - uVar3),
                                in_RCX);
    uVar3 = uVar3 + sVar1;
    if (sVar1 == 0) break;
  } while (uVar3 < __nbytes);
  std::__cxx11::string::resize((ulong)plVar2);
  return (ssize_t)plVar2;
}

Assistant:

std::string read(file &f, std::size_t count) {
  std::string buffer(count, '\0');
  std::size_t n = 0, offset = 0;
  do {
    n = f.read(&buffer[offset], count - offset);
    // We can't read more than size_t bytes since count has type size_t.
    offset += n;
  } while (offset < count && n != 0);
  buffer.resize(offset);
  return buffer;
}